

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O2

bool __thiscall date::year_month_day::ok(year_month_day *this)

{
  day dVar1;
  bool bVar2;
  year_month_day_last local_c;
  
  local_c.mdl_.m_.m_ = (month)(this->m_).m_;
  if ((byte)((char)local_c.mdl_.m_.m_ - 1U) < 0xc) {
    if ((this->d_).d_ == '\0') {
      bVar2 = false;
    }
    else {
      local_c.y_.y_ = (this->y_).y_;
      dVar1 = year_month_day_last::day(&local_c);
      bVar2 = (this->d_).d_ <= dVar1.d_;
    }
    return bVar2;
  }
  return false;
}

Assistant:

CONSTCD11 inline bool month::ok() const NOEXCEPT {return 1 <= m_ && m_ <= 12;}